

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocationsOutOfOrder_TestShell::createTest
          (TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocationsOutOfOrder_TestShell
           *this)

{
  TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocationsOutOfOrder_Test *this_00;
  TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocationsOutOfOrder_TestShell
  *this_local;
  
  this_00 = (TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocationsOutOfOrder_Test *)
            operator_new(0x68,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
                         ,0x188);
  TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocationsOutOfOrder_Test::
  TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocationsOutOfOrder_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestMemoryAccountant, countAllocationsPerSizeMultipleAllocationsOutOfOrder)
{
    accountant.alloc(4);
    accountant.alloc(8);
    accountant.alloc(4);
    accountant.alloc(5);
    accountant.alloc(2);
    accountant.alloc(4);
    accountant.alloc(10);

    LONGS_EQUAL(3, accountant.totalAllocationsOfSize(4));
    LONGS_EQUAL(1, accountant.totalAllocationsOfSize(8));
    LONGS_EQUAL(1, accountant.totalAllocationsOfSize(10));
    LONGS_EQUAL(7, accountant.totalAllocations());
}